

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int parseHhMmSs(char *zDate,DateTime *p)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  byte *zDate_00;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int *piVar14;
  int s;
  int m;
  int h;
  int local_30;
  int nHr;
  
  piVar14 = &m;
  uVar13 = 0;
  uVar12 = 0x3b;
  uVar11 = 0;
  uVar10 = 2;
  iVar3 = getDigits(zDate,2,0,0x18,0x3a,&h,2,0,0x3b,0,piVar14);
  if (iVar3 != 2) {
    return 1;
  }
  if (zDate[5] == ':') {
    iVar3 = getDigits(zDate + 6,2,0,0x3b,0,&s,uVar10,uVar11,uVar12,uVar13,piVar14);
    if (iVar3 != 1) {
      return 1;
    }
    zDate_00 = (byte *)(zDate + 8);
    dVar8 = 0.0;
    if ((zDate[8] == '.') && (uVar5 = (ulong)(byte)zDate[9], 0xfffffffffffffff5 < uVar5 - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      dVar9 = 1.0;
      while (0xfffffffffffffff5 < uVar5 - 0x3a) {
        dVar8 = dVar8 * 10.0 + (double)(int)(char)uVar5 + -48.0;
        dVar9 = dVar9 * 10.0;
        pbVar7 = zDate_00 + 1;
        zDate_00 = zDate_00 + 1;
        uVar5 = (ulong)*pbVar7;
      }
      dVar8 = dVar8 / dVar9;
    }
  }
  else {
    s = 0;
    zDate_00 = (byte *)(zDate + 5);
    dVar8 = 0.0;
  }
  p->validHMS = '\x01';
  p->validJD = '\0';
  p->h = h;
  p->m = m;
  p->s = (double)s + dVar8;
  do {
    pbVar7 = zDate_00;
    zDate_00 = pbVar7 + 1;
  } while ((""[*pbVar7] & 1) != 0);
  p->tz = 0;
  bVar6 = *pbVar7;
  if (bVar6 == 0x2d) {
    iVar3 = -1;
LAB_001841ef:
    iVar4 = getDigits((char *)zDate_00,2,0,0xe,0x3a,&nHr,2,0,0x3b,0,&local_30);
    if (iVar4 != 2) {
      return 1;
    }
    zDate_00 = pbVar7 + 6;
    local_30 = nHr * 0x3c + local_30;
    p->tz = iVar3 * local_30;
    bVar1 = local_30 != 0;
  }
  else {
    if (bVar6 == 0x2b) {
      iVar3 = 1;
      goto LAB_001841ef;
    }
    bVar2 = false;
    bVar1 = false;
    if ((bVar6 & 0xdf) != 0x5a) goto LAB_0018426a;
  }
  do {
    bVar2 = bVar1;
    bVar6 = *zDate_00;
    zDate_00 = zDate_00 + 1;
    bVar1 = bVar2;
  } while ((""[bVar6] & 1) != 0);
LAB_0018426a:
  if (bVar6 == 0) {
    p->validTZ = bVar2;
  }
  return (uint)(bVar6 != 0);
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, 2, 0, 24, ':', &h, 2, 0, 59, 0, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, 2, 0, 59, 0, &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  p->validTZ = (p->tz!=0)?1:0;
  return 0;
}